

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR1.cpp
# Opt level: O2

Node * __thiscall LR::parser(LR *this,string *str)

{
  _Rb_tree_header *p_Var1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  pointer *ppiVar2;
  pointer piVar3;
  pointer pbVar4;
  bool bVar5;
  actionStat aVar6;
  ostream *poVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  Node *pNVar10;
  mapped_type *__x;
  ulong uVar11;
  int i_1;
  int i;
  long lVar12;
  ulong uVar13;
  vector<Node_*,_std::allocator<Node_*>_> node_vec;
  vector<Node_*,_std::allocator<Node_*>_> childs;
  Node *father;
  pair<LR::actionStat,_int> act;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  goto_pair;
  string string1;
  Prod p_1;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p;
  int local_204;
  _Vector_base<Node_*,_std::allocator<Node_*>_> local_1c8;
  _Vector_base<Node_*,_std::allocator<Node_*>_> local_1a8;
  map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
  *local_190;
  Node *local_188;
  mapped_type local_180;
  undefined1 local_178 [40];
  string local_150;
  string local_130;
  Prod local_110;
  undefined1 local_78 [40];
  string local_50;
  
  poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar7 = std::operator<<(poVar7,"************parse...");
  poVar7 = std::operator<<(poVar7,(string *)str);
  poVar7 = std::operator<<(poVar7,"*************");
  std::endl<char,std::char_traits<char>>(poVar7);
  local_1c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->inStr;
  p_Var1 = &(this->ACTION)._M_t._M_impl.super__Rb_tree_header;
  this_01 = &this->parse;
  local_190 = &this->GOTO;
  bVar5 = false;
  local_204 = 0;
  do {
    if (bVar5) break;
    poVar7 = std::operator<<((ostream *)&std::cout,"step:");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_204);
    std::endl<char,std::char_traits<char>>(poVar7);
    piVar3 = (this->status).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pbVar4 = (this->inStr).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar12 = ((long)(this->inStr).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) * 0x8000000 +
             -0x100000000;
    std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_78,
               (int *)((((long)(this->status).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar3) * 0x40000000 +
                        -0x100000000 >> 0x1e) + (long)piVar3),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(pbVar4->_M_dataplus)._M_p + (lVar12 >> 0x1b)));
    iVar8 = std::
            _Rb_tree<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>,_std::_Select1st<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
            ::find(&(this->ACTION)._M_t,
                   (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_78);
    if ((_Rb_tree_header *)iVar8._M_node != p_Var1) {
      pmVar9 = std::
               map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<LR::actionStat,_int>_>_>_>
               ::operator[](&this->ACTION,
                            (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_78);
      local_180 = *pmVar9;
      aVar6 = local_180.first;
      if (aVar6 == ACCEPT) {
        poVar7 = std::operator<<((ostream *)&std::cout,"Success!");
        bVar5 = true;
        std::endl<char,std::char_traits<char>>(poVar7);
      }
      else if (aVar6 == REDUCE) {
        Prod::Prod(&local_110,
                   (this->G).prods.super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.
                   super__Vector_impl_data._M_start + ((long)local_180 >> 0x20));
        Prod::all_str_abi_cxx11_(&local_150,&local_110);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_178,"REDUCE: ",&local_150);
        poVar7 = std::operator<<((ostream *)&std::cout,(string *)local_178);
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::string::~string((string *)local_178);
        local_1a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        lVar12 = 0;
        uVar13 = 0;
        while( true ) {
          uVar11 = (long)local_110.right.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_110.right.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          if (uVar11 <= uVar13) break;
          std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                    ((vector<Node_*,_std::allocator<Node_*>_> *)&local_1a8,
                     (value_type *)
                     ((long)local_1c8._M_impl.super__Vector_impl_data._M_finish +
                     lVar12 + uVar11 * -8));
          uVar13 = uVar13 + 1;
          lVar12 = lVar12 + 8;
        }
        if (local_110.right.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_110.right.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          for (uVar13 = 0;
              uVar13 < (ulong)((long)local_110.right.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_110.right.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar13 = uVar13 + 1) {
            ppiVar2 = &(this->status).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppiVar2 = *ppiVar2 + -1;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::pop_back(this_01);
            local_1c8._M_impl.super__Vector_impl_data._M_finish =
                 local_1c8._M_impl.super__Vector_impl_data._M_finish + -1;
          }
        }
        pNVar10 = (Node *)operator_new(0x100);
        std::__cxx11::string::string((string *)&local_50,(string *)&local_110);
        Node::Node(pNVar10,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        local_188 = pNVar10;
        Prod::operator=(&pNVar10->prod,&local_110);
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                  ((vector<Node_*,_std::allocator<Node_*>_> *)&local_1c8,&local_188);
        std::vector<Node_*,_std::allocator<Node_*>_>::operator=
                  (&local_1c8._M_impl.super__Vector_impl_data._M_finish[-1]->childs,
                   (vector<Node_*,_std::allocator<Node_*>_> *)&local_1a8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this_01,&local_110.noTerminal);
        std::
        pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_178,
                   (this->status).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + -1,&local_110.noTerminal);
        __x = std::
              map<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
              ::operator[](local_190,
                           (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_178);
        std::vector<int,_std::allocator<int>_>::push_back(&this->status,__x);
        std::__cxx11::string::~string((string *)(local_178 + 8));
        std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base(&local_1a8);
        std::__cxx11::string::~string((string *)&local_150);
        Prod::~Prod(&local_110);
      }
      else if (aVar6 == SHIFT) {
        poVar7 = std::operator<<((ostream *)&std::cout,"SHIFT");
        std::endl<char,std::char_traits<char>>(poVar7);
        pNVar10 = (Node *)operator_new(0x100);
        lVar12 = lVar12 >> 0x20;
        std::__cxx11::string::string
                  ((string *)&local_130,
                   (string *)
                   ((this_00->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + lVar12));
        Node::Node(pNVar10,&local_130);
        local_110.noTerminal._M_dataplus._M_p = (pointer)pNVar10;
        std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                  ((vector<Node*,std::allocator<Node*>> *)&local_1c8,(Node **)&local_110);
        std::__cxx11::string::~string((string *)&local_130);
        std::vector<int,_std::allocator<int>_>::push_back(&this->status,&local_180.second);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this_01,(this_00->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + lVar12);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(this_00);
      }
      local_204 = local_204 + 1;
    }
    std::__cxx11::string::~string((string *)(local_78 + 8));
  } while ((_Rb_tree_header *)iVar8._M_node != p_Var1);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cout,"parse error!");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  pNVar10 = *local_1c8._M_impl.super__Vector_impl_data._M_start;
  std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base(&local_1c8);
  return pNVar10;
}

Assistant:

Node *LR::parser(string &str) {
    cout << endl << "************parse..." << str << "*************" << endl;

    bool success = false;
    vector<Node *> node_vec;
    int step = 0;
    while (!success) {
        cout << "step:" << step << endl;
        int sTop = status.size() - 1; // 栈顶
        int iTop = inStr.size() - 1;
        pair<int, string> p = make_pair(status[sTop], inStr[iTop]);
        if (ACTION.find(p) == ACTION.end())  // 出错！
            break;
        pair<actionStat, int> act = ACTION[p];
        if (act.first == SHIFT) { // 移进
            cout << "SHIFT" << endl;
            node_vec.push_back(new Node(inStr[iTop]));

            status.push_back(act.second);
            parse.push_back(inStr[iTop]);
            inStr.pop_back();
        } else if (act.first == REDUCE) {
            Prod p = G.prods[act.second];//要规约的表达式
            string string1 = p.all_str();
            cout << "REDUCE: " + string1 << endl;
            vector<Node *> childs;
            for (int i = 0; i < p.right.size(); i++) {
                childs.push_back(node_vec[i + node_vec.size() - p.right.size()]);
            }


            if (p.right.size() != 0) { // 空串，无需出栈，直接规约
                for (int i = 0; i < p.right.size(); i++) {
                    status.pop_back();
                    parse.pop_back();
                    node_vec.pop_back();
                }
            }
            Node *father = new Node(p.noTerminal);
            father->prod = p;
            node_vec.push_back(father);
            node_vec[node_vec.size() - 1]->childs = childs;


            parse.push_back(p.noTerminal);
            sTop = status.size() - 1; // 栈顶
            iTop = inStr.size() - 1;
            pair<int, string> goto_pair =
                    make_pair(status[status.size() - 1], p.noTerminal);
            status.push_back(GOTO[goto_pair]);
        } else if (act.first == ACCEPT) {
            success = true;
            cout << "Success!" << endl;
        }
        step++;
    }
    if (!success) {
        cout << "parse error!" << endl;
    }
    return node_vec[0];
}